

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::RadixHTGlobalSourceState::AssignTask
          (RadixHTGlobalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTLocalSourceState *lstate,InterruptState *interrupt_state)

{
  AggregatePartitionState AVar1;
  size_type sVar2;
  long lVar3;
  bool bVar4;
  size_type sVar5;
  type this_00;
  string *msg;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  unique_lock<std::mutex> partition_guard;
  AggregatePartition *partition;
  unique_lock<std::mutex> guard;
  pointer in_stack_ffffffffffffff38;
  InterruptState *in_stack_ffffffffffffff40;
  allocator *this_01;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  allocator local_89;
  string local_88 [64];
  type local_48;
  undefined4 local_3c;
  long local_20;
  long local_18;
  SourceResultType local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  StateWithBlockableTasks::Lock((StateWithBlockableTasks *)in_stack_ffffffffffffff38);
  bVar4 = ::std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)
                     CONCAT17(in_stack_ffffffffffffff4f,
                              CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
  if (!bVar4) {
    sVar2 = *(size_type *)(in_RDI + 0x78);
    sVar5 = ::std::
            vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                    *)(local_18 + 0xf0));
    if (sVar2 != sVar5) {
      lVar3 = *(long *)(in_RDI + 0x78);
      *(long *)(in_RDI + 0x78) = lVar3 + 1;
      *(long *)(local_20 + 0x10) = lVar3;
      vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                    *)in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
      this_00 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                ::operator*((unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                             *)in_stack_ffffffffffffff40);
      local_48 = this_00;
      StateWithBlockableTasks::Lock((StateWithBlockableTasks *)in_stack_ffffffffffffff38);
      AVar1 = local_48->state;
      if (AVar1 == READY_TO_FINALIZE) {
        local_48->state = FINALIZE_IN_PROGRESS;
        *(undefined1 *)(local_20 + 8) = 1;
        local_1 = HAVE_MORE_OUTPUT;
      }
      else if (AVar1 == FINALIZE_IN_PROGRESS) {
        *(undefined1 *)(local_20 + 8) = 2;
        *(undefined1 *)(local_20 + 0x20) = 0;
        local_1 = StateWithBlockableTasks::BlockSource
                            (&this_00->super_StateWithBlockableTasks,
                             (unique_lock<std::mutex> *)
                             CONCAT17(1,CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48
                                                )),in_stack_ffffffffffffff40);
      }
      else {
        if (AVar1 != READY_TO_SCAN) {
          msg = (string *)__cxa_allocate_exception(0x10);
          this_01 = &local_89;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_88,
                     "Unexpected AggregatePartitionState in RadixHTLocalSourceState::Finalize!",
                     this_01);
          InternalException::InternalException((InternalException *)this_01,msg);
          __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
        }
        *(undefined1 *)(local_20 + 8) = 2;
        *(undefined1 *)(local_20 + 0x20) = 0;
        local_1 = HAVE_MORE_OUTPUT;
      }
      local_3c = 1;
      ::std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_ffffffffffffff40);
      goto LAB_007a47f5;
    }
  }
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  ::reset((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
           *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_1 = FINISHED;
  local_3c = 1;
LAB_007a47f5:
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff40)
  ;
  return local_1;
}

Assistant:

SourceResultType RadixHTGlobalSourceState::AssignTask(RadixHTGlobalSinkState &sink, RadixHTLocalSourceState &lstate,
                                                      InterruptState &interrupt_state) {
	// First, try to get a partition index
	auto guard = sink.Lock();
	if (finished || task_idx == sink.partitions.size()) {
		lstate.ht.reset();
		return SourceResultType::FINISHED;
	}
	lstate.task_idx = task_idx++;

	// We got a partition index
	auto &partition = *sink.partitions[lstate.task_idx];
	auto partition_guard = partition.Lock();
	switch (partition.state) {
	case AggregatePartitionState::READY_TO_FINALIZE:
		partition.state = AggregatePartitionState::FINALIZE_IN_PROGRESS;
		lstate.task = RadixHTSourceTaskType::FINALIZE;
		return SourceResultType::HAVE_MORE_OUTPUT;
	case AggregatePartitionState::FINALIZE_IN_PROGRESS:
		lstate.task = RadixHTSourceTaskType::SCAN;
		lstate.scan_status = RadixHTScanStatus::INIT;
		return partition.BlockSource(partition_guard, interrupt_state);
	case AggregatePartitionState::READY_TO_SCAN:
		lstate.task = RadixHTSourceTaskType::SCAN;
		lstate.scan_status = RadixHTScanStatus::INIT;
		return SourceResultType::HAVE_MORE_OUTPUT;
	default:
		throw InternalException("Unexpected AggregatePartitionState in RadixHTLocalSourceState::Finalize!");
	}
}